

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O0

void __thiscall rw::HAnimHierarchy::updateMatrices(HAnimHierarchy *this)

{
  AnimInterpolator *this_00;
  ApplyCB p_Var1;
  V3d *pVVar2;
  Frame *this_01;
  Matrix *__src;
  InterpFrameHeader *pIVar3;
  HAnimNodeInfo *local_2d0;
  HAnimNodeInfo *node;
  AnimInterpolator *anim;
  int32 i;
  Frame *parfrm;
  Frame *frm;
  Matrix *stack [64];
  Matrix **sp;
  Matrix *parentMat;
  Matrix *curMat;
  Matrix animMat;
  Matrix rootMat;
  HAnimHierarchy *this_local;
  
  this_00 = this->interpolator;
  stack[0x3f] = (Matrix *)&frm;
  parentMat = this->matrices;
  if (this->parentFrame != (Frame *)0x0) {
    this_01 = Frame::getParent(this->parentFrame);
    if ((this_01 != (Frame *)0x0) && ((this->flags & 0x4000U) == 0)) {
      __src = Frame::getLTM(this_01);
      memcpy(&animMat.pos.z,__src,0x40);
      goto LAB_0010f3c7;
    }
  }
  Matrix::setIdentity((Matrix *)&animMat.pos.z);
LAB_0010f3c7:
  sp = (Matrix **)&animMat.pos.z;
  pVVar2 = &stack[0x3f]->right;
  stack[0x3f] = (Matrix *)&(stack[0x3f]->right).z;
  *(Matrix ***)pVVar2 = sp;
  local_2d0 = this->nodeInfo;
  for (anim._4_4_ = 0; anim._4_4_ < this->numNodes; anim._4_4_ = anim._4_4_ + 1) {
    p_Var1 = this_00->applyCB;
    pIVar3 = AnimInterpolator::getInterpFrame(this_00,anim._4_4_);
    (*p_Var1)(&curMat,pIVar3);
    Matrix::mult(parentMat,(Matrix *)&curMat,(Matrix *)sp);
    if ((local_2d0->flags & 2U) != 0) {
      pVVar2 = &stack[0x3f]->right;
      stack[0x3f] = (Matrix *)&(stack[0x3f]->right).z;
      *(Matrix ***)pVVar2 = sp;
    }
    sp = (Matrix **)parentMat;
    if ((local_2d0->flags & 1U) != 0) {
      sp = *(Matrix ***)&stack[0x3f][-1].pos.z;
      stack[0x3f] = (Matrix *)&stack[0x3f][-1].pos.z;
    }
    local_2d0 = local_2d0 + 1;
    parentMat = parentMat + 1;
  }
  return;
}

Assistant:

void
HAnimHierarchy::updateMatrices(void)
{
	// TODO: handle more (all!) cases

	Matrix rootMat, animMat;
	Matrix *curMat, *parentMat;
	Matrix **sp, *stack[64];
	Frame *frm, *parfrm;
	int32 i;
	AnimInterpolator *anim = this->interpolator;

	sp = stack;
	curMat = this->matrices;

	frm = this->parentFrame;
	if(frm && (parfrm = frm->getParent()) && !(this->flags&LOCALSPACEMATRICES))
		rootMat = *parfrm->getLTM();
	else
		rootMat.setIdentity();
	parentMat = &rootMat;
	*sp++ = parentMat;
	HAnimNodeInfo *node = this->nodeInfo;
	for(i = 0; i < this->numNodes; i++){
		anim->applyCB(&animMat, anim->getInterpFrame(i));

		// TODO: here we could update local matrices

		Matrix::mult(curMat, &animMat, parentMat);

		// TODO: here we could update LTM

		if(node->flags & PUSH)
			*sp++ = parentMat;
		parentMat = curMat;
		if(node->flags & POP)
			parentMat = *--sp;
		assert(sp >= stack);
		assert(sp <= &stack[64]);

		node++;
		curMat++;
	}
}